

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O2

size_t io::net::
       write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                 (undefined8 stream,undefined8 buffers)

{
  size_t sVar1;
  system_error *this;
  error_code __ec;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                    (stream,buffers,&ec);
  if (ec._M_value == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = ec._M_value;
  __ec._M_cat = ec._M_cat;
  std::system_error::system_error(this,__ec,"write");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_written = write(stream, buffers,
                                      completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_written;
}